

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

bool __thiscall glslang::TType::sameSpirvType(TType *this,TType *right)

{
  TSpirvType *this_00;
  TSpirvType *__str;
  TSpirvTypeParameter *pTVar1;
  bool bVar2;
  int iVar3;
  TSpirvTypeParameter *this_01;
  TSpirvTypeParameter *rhs;
  bool bVar4;
  
  this_00 = this->spirvType;
  __str = right->spirvType;
  bVar4 = this_00 == (TSpirvType *)0x0 && __str == (TSpirvType *)0x0;
  if (__str != (TSpirvType *)0x0 && this_00 != (TSpirvType *)0x0) {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      this_00,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)__str);
    bVar4 = false;
    if ((iVar3 == 0) && (bVar4 = false, (this_00->spirvInst).id == (__str->spirvInst).id)) {
      this_01 = (this_00->typeParams).
                super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                .
                super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (this_00->typeParams).
               super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
               .
               super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      rhs = (__str->typeParams).
            super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
            .
            super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
            ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pTVar1 - (long)this_01 ==
          (long)(__str->typeParams).
                super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                .
                super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)rhs) {
        bVar4 = this_01 == pTVar1;
        if ((!bVar4) && (bVar2 = TSpirvTypeParameter::operator==(this_01,rhs), bVar2)) {
          do {
            rhs = rhs + 1;
            this_01 = this_01 + 1;
            bVar4 = this_01 == pTVar1;
            if (bVar4) {
              return bVar4;
            }
            bVar2 = TSpirvTypeParameter::operator==(this_01,rhs);
          } while (bVar2);
        }
      }
      else {
        bVar4 = false;
      }
    }
  }
  return bVar4;
}

Assistant:

bool sameSpirvType(const TType& right) const
    {
        return ((spirvType == nullptr && right.spirvType == nullptr) ||
                (spirvType != nullptr && right.spirvType != nullptr && *spirvType == *right.spirvType));
    }